

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O0

Index __thiscall wasm::Flatten::getTempForBreakTarget(Flatten *this,Name name,Type type)

{
  bool bVar1;
  pointer ppVar2;
  Module *wasm;
  Function *func;
  mapped_type *pmVar3;
  Builder local_48;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_40;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_38;
  iterator iter;
  Flatten *this_local;
  Type type_local;
  Name name_local;
  
  type_local.id = name.super_IString.str._M_len;
  iter.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>)this;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
       ::find(&this->breakTemps,(key_type *)&type_local);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
       ::end(&this->breakTemps);
  bVar1 = std::__detail::operator!=(&local_38,&local_40);
  if (bVar1) {
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true> *)
                        &local_38);
    name_local.super_IString.str._M_str._4_4_ = ppVar2->second;
  }
  else {
    wasm = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::getModule
                     ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *
                      )&(this->
                        super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                        ).
                        super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                     );
    Builder::Builder(&local_48,wasm);
    func = Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::getFunction
                     ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *
                      )&(this->
                        super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                        ).
                        super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                     );
    name_local.super_IString.str._M_str._4_4_ = Builder::addVar(func,type);
    pmVar3 = std::
             unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
             ::operator[](&this->breakTemps,(key_type *)&type_local);
    *pmVar3 = name_local.super_IString.str._M_str._4_4_;
  }
  return name_local.super_IString.str._M_str._4_4_;
}

Assistant:

Index getTempForBreakTarget(Name name, Type type) {
    auto iter = breakTemps.find(name);
    if (iter != breakTemps.end()) {
      return iter->second;
    } else {
      return breakTemps[name] =
               Builder(*getModule()).addVar(getFunction(), type);
    }
  }